

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldsTable.cpp
# Opt level: O2

void __thiscall ser::FieldsTable::RegisterField(FieldsTable *this,DataFieldInfo *dataFieldInfo)

{
  bool bVar1;
  mapped_type *this_00;
  SerializationException *this_01;
  SerializationException exception;
  string name;
  string msg;
  
  std::__cxx11::string::string((string *)&name,(string *)dataFieldInfo);
  bVar1 = HasField(this,&name);
  if (!bVar1) {
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>_>
              ::operator[](&this->data_,&name);
    DataFieldInfo::operator=(this_00,dataFieldInfo);
    std::__cxx11::string::~string((string *)&name);
    return;
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&exception,
                 "Error: trying to register the field ",&name);
  std::operator+(&msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &exception,", which is already registered\n");
  std::__cxx11::string::~string((string *)&exception);
  exception._0_8_ = &PTR__SerializationException_00138910;
  exception.message_._M_dataplus._M_p = (pointer)&exception.message_.field_2;
  exception.message_._M_string_length = 0;
  exception.message_.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&exception.message_);
  this_01 = (SerializationException *)__cxa_allocate_exception(0x28);
  SerializationException::SerializationException(this_01,&exception);
  __cxa_throw(this_01,&SerializationException::typeinfo,
              SerializationException::~SerializationException);
}

Assistant:

void FieldsTable::RegisterField(const DataFieldInfo& dataFieldInfo)
{
    const std::string name = dataFieldInfo.name();

    if (HasField(name))
    {
        // Field is already registered
        std::string msg = "Error: trying to register the field " + name
                        + ", which is already registered\n";
        SerializationException exception;
        exception.Init(msg);
        throw exception;
    }

    // Register field
    data_[name] = dataFieldInfo;
}